

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.hpp
# Opt level: O2

ostream * color::operator<<(ostream *os,shell_command command)

{
  ostream *poVar1;
  
  current.command = command.command;
  poVar1 = std::operator<<(os,command.command);
  return poVar1;
}

Assistant:

inline std::ostream & operator<<(std::ostream & os, shell_command command) {
	color::current = command;
	return os << command.command;
}